

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O1

void __thiscall
arma::Mat<double>::Mat<arma::subview_col<double>,arma::subview_col<double>,arma::eglue_schur>
          (Mat<double> *this,
          eGlue<arma::subview_col<double>,_arma::subview_col<double>,_arma::eglue_schur> *X)

{
  uint uVar1;
  subview_col<double> *psVar2;
  double *pdVar3;
  double *pdVar4;
  uword uVar5;
  double *pdVar6;
  ulong uVar7;
  ea_type P1;
  char (*x) [39];
  ulong uVar8;
  
  psVar2 = (X->P1).Q;
  this->n_rows = (psVar2->super_subview<double>).n_rows;
  this->n_cols = 1;
  uVar1 = (psVar2->super_subview<double>).n_elem;
  uVar7 = (ulong)uVar1;
  uVar5 = 0;
  this->n_elem = uVar1;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  if (uVar7 < 0x11) {
    pdVar6 = this->mem_local;
    if (uVar7 == 0) {
      pdVar6 = (double *)0x0;
    }
    this->mem = pdVar6;
  }
  else {
    x = (char (*) [39])(uVar7 << 3);
    pdVar6 = (double *)lkalloc::malloc((size_t)x);
    if (pdVar6 == (double *)0x0) {
      arma_stop_bad_alloc<char[39]>(x);
      Optim::reparametrize = (bool)(char)x;
      return;
    }
    this->mem = pdVar6;
    uVar5 = this->n_elem;
  }
  this->n_alloc = uVar5;
  pdVar6 = this->mem;
  psVar2 = (X->P1).Q;
  uVar7 = (ulong)(psVar2->super_subview<double>).n_elem;
  if (((ulong)pdVar6 & 0xf) == 0) {
    pdVar3 = psVar2->colmem;
    if ((((ulong)pdVar3 & 0xf) == 0) && (pdVar4 = ((X->P2).Q)->colmem, ((ulong)pdVar4 & 0xf) == 0))
    {
      if (uVar7 != 0) {
        uVar8 = 0;
        do {
          pdVar6[uVar8] = pdVar3[uVar8] * pdVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
    }
    else if (uVar7 != 0) {
      pdVar4 = ((X->P2).Q)->colmem;
      uVar8 = 0;
      do {
        pdVar6[uVar8] = pdVar3[uVar8] * pdVar4[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
    }
  }
  else if (uVar7 != 0) {
    pdVar3 = psVar2->colmem;
    pdVar4 = ((X->P2).Q)->colmem;
    uVar8 = 0;
    do {
      pdVar6[uVar8] = pdVar3[uVar8] * pdVar4[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar7 != uVar8);
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eGlue<T1, T2, eglue_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  arma_type_check(( is_same_type< eT, typename T2::elem_type >::no ));
  
  init_cold();
  
  eglue_type::apply(*this, X);
  }